

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_gettabup(function *fn,int A,int B,int C,int pc,OpCode op)

{
  OpCode op_local;
  int pc_local;
  int C_local;
  int B_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  emit_reg_or_k(fn,"rc",C);
  emit_update_savedpc(fn,pc);
  if (op == OP_RAVI_GETTABUP_SK) {
    membuff_add_fstring(&fn->body,"raviV_gettable_sskey(L, cl->upvals[%d]->v, rc, ra);\n",
                        (ulong)(uint)B);
  }
  else {
    membuff_add_fstring(&fn->body,"luaV_gettable(L, cl->upvals[%d]->v, rc, ra);\n",(ulong)(uint)B);
  }
  membuff_add_string(&fn->body,"base = ci->u.l.base;\n");
  return;
}

Assistant:

static void emit_op_gettabup(struct function *fn, int A, int B, int C, int pc, OpCode op) {
  emit_reg(fn, "ra", A);
  emit_reg_or_k(fn, "rc", C);
  emit_update_savedpc(fn, pc);
  if (op == OP_RAVI_GETTABUP_SK) {
    membuff_add_fstring(&fn->body, "raviV_gettable_sskey(L, cl->upvals[%d]->v, rc, ra);\n", B);
  }
  else {
    membuff_add_fstring(&fn->body, "luaV_gettable(L, cl->upvals[%d]->v, rc, ra);\n", B);
  }
  membuff_add_string(&fn->body, "base = ci->u.l.base;\n");
}